

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geo_parquet.cpp
# Opt level: O1

void __thiscall
duckdb::GeoParquetFileMetadata::RegisterGeometryColumn
          (GeoParquetFileMetadata *this,string *column_name)

{
  _Rb_tree_header *p_Var1;
  int iVar2;
  mapped_type *pmVar3;
  undefined8 uVar4;
  _Rb_tree<duckdb::WKBGeometryType,_duckdb::WKBGeometryType,_std::_Identity<duckdb::WKBGeometryType>,_std::less<duckdb::WKBGeometryType>,_std::allocator<duckdb::WKBGeometryType>_>
  _Stack_a0;
  double dStack_70;
  double local_68;
  double dStack_60;
  double local_58;
  undefined8 *puStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)this);
  if (iVar2 == 0) {
    if ((this->primary_geometry_column)._M_string_length == 0) {
      std::__cxx11::string::_M_assign((string *)&this->primary_geometry_column);
    }
    p_Var1 = &_Stack_a0._M_impl.super__Rb_tree_header;
    _Stack_a0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    _Stack_a0._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    _Stack_a0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    _Stack_a0._M_impl._0_8_ = 0;
    local_38 = 0;
    _Stack_a0._M_impl.super__Rb_tree_header._M_node_count = 0;
    dStack_70 = 1.79769313486232e+308;
    local_68 = -1.79769313486232e+308;
    dStack_60 = 1.79769313486232e+308;
    local_58 = -1.79769313486232e+308;
    local_48 = 0;
    uStack_40 = 0;
    _Stack_a0._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    _Stack_a0._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
    puStack_50 = &uStack_40;
    pmVar3 = std::__detail::
             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::GeoParquetColumnMetadata>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::GeoParquetColumnMetadata>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::GeoParquetColumnMetadata>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::GeoParquetColumnMetadata>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)&this->geometry_columns,column_name);
    pmVar3->geometry_encoding = 0;
    std::
    _Rb_tree<duckdb::WKBGeometryType,_duckdb::WKBGeometryType,_std::_Identity<duckdb::WKBGeometryType>,_std::less<duckdb::WKBGeometryType>,_std::allocator<duckdb::WKBGeometryType>_>
    ::clear(&(pmVar3->geometry_types)._M_t);
    if (_Stack_a0._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
      (pmVar3->geometry_types)._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
           _Stack_a0._M_impl.super__Rb_tree_header._M_header._M_color;
      (pmVar3->geometry_types)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           _Stack_a0._M_impl.super__Rb_tree_header._M_header._M_parent;
      (pmVar3->geometry_types)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           _Stack_a0._M_impl.super__Rb_tree_header._M_header._M_left;
      (pmVar3->geometry_types)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           _Stack_a0._M_impl.super__Rb_tree_header._M_header._M_right;
      (_Stack_a0._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent =
           &(pmVar3->geometry_types)._M_t._M_impl.super__Rb_tree_header._M_header;
      (pmVar3->geometry_types)._M_t._M_impl.super__Rb_tree_header._M_node_count =
           _Stack_a0._M_impl.super__Rb_tree_header._M_node_count;
      _Stack_a0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      _Stack_a0._M_impl.super__Rb_tree_header._M_node_count = 0;
      _Stack_a0._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
      _Stack_a0._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
    }
    (pmVar3->bbox).min_y = dStack_60;
    (pmVar3->bbox).max_y = local_58;
    (pmVar3->bbox).min_x = dStack_70;
    (pmVar3->bbox).max_x = local_68;
    std::__cxx11::string::operator=((string *)&pmVar3->projjson,(string *)&puStack_50);
    if (puStack_50 != &uStack_40) {
      operator_delete(puStack_50);
    }
    std::
    _Rb_tree<duckdb::WKBGeometryType,_duckdb::WKBGeometryType,_std::_Identity<duckdb::WKBGeometryType>,_std::less<duckdb::WKBGeometryType>,_std::allocator<duckdb::WKBGeometryType>_>
    ::~_Rb_tree(&_Stack_a0);
    pthread_mutex_unlock((pthread_mutex_t *)this);
    return;
  }
  uVar4 = std::__throw_system_error(iVar2);
  pthread_mutex_unlock((pthread_mutex_t *)this);
  _Unwind_Resume(uVar4);
}

Assistant:

void GeoParquetFileMetadata::RegisterGeometryColumn(const string &column_name) {
	lock_guard<mutex> glock(write_lock);
	if (primary_geometry_column.empty()) {
		primary_geometry_column = column_name;
	}
	geometry_columns[column_name] = GeoParquetColumnMetadata();
}